

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O0

Error __thiscall asmjit::X86Assembler::align(X86Assembler *this,uint32_t mode,uint32_t alignment)

{
  int iVar1;
  uint uVar2;
  Error EVar3;
  uint uVar4;
  uint *puVar5;
  uint8_t *puVar6;
  uint in_EDX;
  uint in_ESI;
  char *in_RDI;
  float in_XMM0_Da;
  uint8_t *src;
  uint32_t n;
  uint8_t pattern;
  uint8_t *cursor;
  Error err;
  uint32_t i;
  undefined8 in_stack_ffffffffffffff80;
  Error error;
  uint8_t *puVar7;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint8_t uVar8;
  CodeBuffer *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  Error local_44;
  
  error = (Error)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  if ((*(uint *)(in_RDI + 0x38) & 4) != 0) {
    Logger::logf(*(Logger **)(*(long *)(in_RDI + 0x18) + 0x28),in_XMM0_Da);
  }
  if (in_ESI < 3) {
    if (in_EDX < 2) {
      local_44 = 0;
    }
    else if ((in_EDX == 0 || (in_EDX & in_EDX - 1) != 0) || (0x40 < in_EDX)) {
      local_44 = CodeEmitter::setLastError
                           ((CodeEmitter *)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),error,
                            in_RDI);
    }
    else {
      iVar1 = (int)*(undefined8 *)(in_RDI + 0x90) - (int)*(undefined8 *)(in_RDI + 0x80);
      uVar2 = (iVar1 + (in_EDX - 1) & (in_EDX - 1 ^ 0xffffffff)) - iVar1;
      if (uVar2 == 0) {
        local_44 = 0;
      }
      else if (((ulong)(*(long *)(in_RDI + 0x88) - *(long *)(in_RDI + 0x90)) < (ulong)uVar2) &&
              (EVar3 = CodeHolder::growBuffer
                                 ((CodeHolder *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff98,
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)),
              EVar3 != 0)) {
        local_44 = CodeEmitter::setLastError
                             ((CodeEmitter *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),error,
                              in_RDI);
      }
      else {
        puVar6 = *(uint8_t **)(in_RDI + 0x90);
        uVar8 = '\0';
        if (in_ESI == 0) {
          if ((*(uint *)(in_RDI + 0x34) & 1) != 0) {
            do {
              puVar5 = std::min<unsigned_int>
                                 ((uint *)&stack0xffffffffffffffa4,(uint *)&stack0xffffffffffffff8c)
              ;
              uVar4 = *puVar5;
              uVar2 = uVar2 - uVar4;
              puVar7 = align::nopData[uVar4 - 1];
              do {
                *puVar6 = *puVar7;
                puVar6 = puVar6 + 1;
                uVar4 = uVar4 - 1;
                puVar7 = puVar7 + 1;
              } while (uVar4 != 0);
            } while (uVar2 != 0);
            uVar2 = 0;
          }
          uVar8 = 0x90;
        }
        else if (in_ESI == 1) {
          uVar8 = 0xcc;
        }
        for (; uVar2 != 0; uVar2 = uVar2 - 1) {
          *puVar6 = uVar8;
          puVar6 = puVar6 + 1;
        }
        *(uint8_t **)(in_RDI + 0x90) = puVar6;
        local_44 = 0;
      }
    }
  }
  else {
    local_44 = CodeEmitter::setLastError
                         ((CodeEmitter *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),error,in_RDI
                         );
  }
  return local_44;
}

Assistant:

Error X86Assembler::align(uint32_t mode, uint32_t alignment) {
#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled)
    _code->_logger->logf("%s.align %u\n", _code->_logger->getIndentation(), alignment);
#endif // !ASMJIT_DISABLE_LOGGING

  if (mode >= kAlignCount)
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment <= 1)
    return kErrorOk;

  if (!Utils::isPowerOf2(alignment) || alignment > Globals::kMaxAlignment)
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t i = static_cast<uint32_t>(Utils::alignDiff<size_t>(getOffset(), alignment));
  if (i == 0)
    return kErrorOk;

  if (getRemainingSpace() < i) {
    Error err = _code->growBuffer(&_section->_buffer, i);
    if (ASMJIT_UNLIKELY(err)) return setLastError(err);
  }

  uint8_t* cursor = _bufferPtr;
  uint8_t pattern = 0x00;

  switch (mode) {
    case kAlignCode: {
      if (_globalHints & kHintOptimizedAlign) {
        // Intel 64 and IA-32 Architectures Software Developer's Manual - Volume 2B (NOP).
        enum { kMaxNopSize = 9 };

        static const uint8_t nopData[kMaxNopSize][kMaxNopSize] = {
          { 0x90 },
          { 0x66, 0x90 },
          { 0x0F, 0x1F, 0x00 },
          { 0x0F, 0x1F, 0x40, 0x00 },
          { 0x0F, 0x1F, 0x44, 0x00, 0x00 },
          { 0x66, 0x0F, 0x1F, 0x44, 0x00, 0x00 },
          { 0x0F, 0x1F, 0x80, 0x00, 0x00, 0x00, 0x00 },
          { 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 },
          { 0x66, 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 }
        };

        do {
          uint32_t n = std::min<uint32_t>(i, kMaxNopSize);
          const uint8_t* src = nopData[n - 1];

          i -= n;
          do {
            EMIT_BYTE(*src++);
          } while (--n);
        } while (i);
      }

      pattern = 0x90;
      break;
    }

    case kAlignData:
      pattern = 0xCC;
      break;

    case kAlignZero:
      // Pattern already set to zero.
      break;
  }

  while (i) {
    EMIT_BYTE(pattern);
    i--;
  }

  _bufferPtr = cursor;
  return kErrorOk;
}